

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQuatSlerp.cpp
# Opt level: O2

void anon_unknown.dwarf_d2c1f::testSlerp(Quatf *q1,Quatf *q2)

{
  int m;
  int iVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double __y;
  Quat<float> QVar2;
  Quat<float> local_138;
  Quat<float> local_128;
  Quat<float> local_118;
  Quat<float> local_100;
  Quat<float> local_f0;
  Quatf qiq3;
  Quatf q1q2;
  Quatf q3;
  Quat<double> local_b0;
  Quat<double> local_90;
  Quat<double> local_70;
  Quat<double> local_50;
  
  for (iVar1 = 0; iVar1 != 0x11; iVar1 = iVar1 + 1) {
    local_128.r = q1->r;
    local_128.v.x = (q1->v).x;
    local_128.v.y = (q1->v).y;
    local_128.v.z = (q1->v).z;
    local_138.r = q2->r;
    local_138.v.x = (q2->v).x;
    local_138.v.y = (q2->v).y;
    local_138.v.z = (q2->v).z;
    local_118.r = 1.0;
    local_118.v.x = 0.0;
    local_118.v.y = 0.0;
    local_118.v.z = 0.0;
    Imath_3_2::Quat<float>::inverse((Quat<float> *)&local_50);
    Imath_3_2::operator*((Imath_3_2 *)&q3,(Quat<float> *)&local_50,&local_138);
    Imath_3_2::slerp<float>((Imath_3_2 *)&q1q2,&local_128,&local_138,(float)iVar1 * 0.0625);
    Imath_3_2::slerp<float>((Imath_3_2 *)&qiq3,&local_118,&q3,(float)iVar1 * 0.0625);
    QVar2 = Imath_3_2::operator*((Imath_3_2 *)&local_50,&local_128,&qiq3);
    __y = QVar2.v._4_8_;
    compareQuats(&q1q2,(Quatf *)&local_50,7.1525574e-06);
    Imath_3_2::Quat<double>::Quat<float>(&local_70,&qiq3);
    pow((anon_unknown_dwarf_d2c1f *)&local_50,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),
        __y);
    Imath_3_2::Quat<float>::Quat<double>(&local_f0,&local_50);
    Imath_3_2::Quat<double>::Quat<float>(&local_b0,&q3);
    pow((anon_unknown_dwarf_d2c1f *)&local_90,
        (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00),__y);
    Imath_3_2::Quat<float>::Quat<double>(&local_100,&local_90);
    compareQuats(&local_f0,&local_100,7.1525574e-05);
  }
  return;
}

Assistant:

void
testSlerp (const Quatf q1, const Quatf q2)
{
    const int n = 16;

    for (int m = 0; m <= n; ++m)
        testSlerp (q1, q2, m, n);
}